

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall DirectiveObjImport::DirectiveObjImport(DirectiveObjImport *this,path *inputName)

{
  int iVar1;
  path *inputName_local;
  DirectiveObjImport *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveObjImport_002aa1b8;
  ElfRelocator::ElfRelocator(&this->rel);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&this->ctor);
  std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
            (&this->ctor,(nullptr_t)0x0);
  iVar1 = ElfRelocator::init(&this->rel,(EVP_PKEY_CTX *)inputName);
  (this->super_CAssemblerCommand).field_0x14 = (byte)iVar1 & 1;
  if (((this->super_CAssemblerCommand).field_0x14 & 1) != 0) {
    ElfRelocator::exportSymbols(&this->rel);
  }
  return;
}

Assistant:

DirectiveObjImport::DirectiveObjImport(const fs::path& inputName)
{
	ctor = nullptr;
	success = rel.init(inputName);
	if (success)
		rel.exportSymbols();
}